

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetField<unsigned_int>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,uint *value)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  
  if (*(long *)(field + 0x60) != 0) {
    bVar2 = HasOneofField(this,message,field);
    if (!bVar2) {
      ClearOneof(this,message,*(OneofDescriptor **)(field + 0x60));
    }
  }
  uVar1 = *value;
  uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3) = uVar1;
  if (*(long *)(field + 0x60) != 0) {
    SetOneofCase(this,message,field);
    return;
  }
  SetBit(this,message,field);
  return;
}

Assistant:

inline void GeneratedMessageReflection::SetField(
    Message* message, const FieldDescriptor* field, const Type& value) const {
  if (field->containing_oneof() && !HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
  *MutableRaw<Type>(message, field) = value;
  field->containing_oneof() ?
      SetOneofCase(message, field) : SetBit(message, field);
}